

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O2

space_info *
boost::filesystem::detail::space(space_info *__return_storage_ptr__,path *p,error_code *ec)

{
  bool bVar1;
  int iVar2;
  uintmax_t uVar3;
  uintmax_t uVar4;
  uintmax_t uVar5;
  statvfs vfs;
  statvfs64 sStack_88;
  
  iVar2 = statvfs64((p->m_pathname)._M_dataplus._M_p,&sStack_88);
  bVar1 = anon_unknown.dwarf_54f5::error((uint)(iVar2 != 0),p,ec,"boost::filesystem::space");
  if (bVar1) {
    uVar3 = 0;
    uVar5 = 0;
    uVar4 = 0;
  }
  else {
    uVar4 = sStack_88.f_blocks * sStack_88.f_frsize;
    uVar5 = sStack_88.f_bfree * sStack_88.f_frsize;
    uVar3 = sStack_88.f_frsize * sStack_88.f_bavail;
  }
  __return_storage_ptr__->available = uVar3;
  __return_storage_ptr__->free = uVar5;
  __return_storage_ptr__->capacity = uVar4;
  return __return_storage_ptr__;
}

Assistant:

BOOST_FILESYSTEM_DECL
  space_info space(const path& p, error_code* ec)
  {
#   ifdef BOOST_POSIX_API
    struct BOOST_STATVFS vfs;
    space_info info;
    if (!error(::BOOST_STATVFS(p.c_str(), &vfs)!= 0,
      p, ec, "boost::filesystem::space"))
    {
      info.capacity 
        = static_cast<boost::uintmax_t>(vfs.f_blocks)* BOOST_STATVFS_F_FRSIZE;
      info.free 
        = static_cast<boost::uintmax_t>(vfs.f_bfree)* BOOST_STATVFS_F_FRSIZE;
      info.available
        = static_cast<boost::uintmax_t>(vfs.f_bavail)* BOOST_STATVFS_F_FRSIZE;
    }

#   else
    ULARGE_INTEGER avail, total, free;
    space_info info;

    if (!error(::GetDiskFreeSpaceExW(p.c_str(), &avail, &total, &free)== 0,
       p, ec, "boost::filesystem::space"))
    {
      info.capacity
        = (static_cast<boost::uintmax_t>(total.HighPart)<< 32)
          + total.LowPart;
      info.free
        = (static_cast<boost::uintmax_t>(free.HighPart)<< 32)
          + free.LowPart;
      info.available
        = (static_cast<boost::uintmax_t>(avail.HighPart)<< 32)
          + avail.LowPart;
    }

#   endif

    else
    {
      info.capacity = info.free = info.available = 0;
    }